

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_19::GeneratedMessageFactory::DescriptorByNameEq::operator()
          (DescriptorByNameEq *this,DescriptorTable *lhs,string_view rhs)

{
  string_view rhs_00;
  bool bVar1;
  string_view local_38;
  DescriptorTable *local_28;
  DescriptorTable *lhs_local;
  DescriptorByNameEq *this_local;
  string_view rhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  this_local = (DescriptorByNameEq *)rhs._M_len;
  local_28 = lhs;
  lhs_local = (DescriptorTable *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,lhs->filename);
  rhs_00._M_str = (char *)rhs_local._M_len;
  rhs_00._M_len = (size_t)this_local;
  bVar1 = operator()(this,local_38,rhs_00);
  return bVar1;
}

Assistant:

bool operator()(const google::protobuf::internal::DescriptorTable* lhs,
                    absl::string_view rhs) const {
      return (*this)(lhs->filename, rhs);
    }